

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

int frame_max_bits(RATE_CONTROL *rc,AV1EncoderConfig *oxcf)

{
  int64_t max_bits;
  AV1EncoderConfig *oxcf_local;
  RATE_CONTROL *rc_local;
  
  max_bits = ((long)rc->avg_frame_bandwidth * (long)(oxcf->rc_cfg).vbrmax_section) / 100;
  if (max_bits < 0) {
    max_bits._0_4_ = 0;
  }
  else {
    if (rc->max_frame_bandwidth < max_bits) {
      max_bits = (int64_t)rc->max_frame_bandwidth;
    }
  }
  return (int)max_bits;
}

Assistant:

static int frame_max_bits(const RATE_CONTROL *rc,
                          const AV1EncoderConfig *oxcf) {
  int64_t max_bits = ((int64_t)rc->avg_frame_bandwidth *
                      (int64_t)oxcf->rc_cfg.vbrmax_section) /
                     100;
  if (max_bits < 0)
    max_bits = 0;
  else if (max_bits > rc->max_frame_bandwidth)
    max_bits = rc->max_frame_bandwidth;

  return (int)max_bits;
}